

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O1

void __thiscall
inject::not_providing::not_providing
          (not_providing *this,unique_id bound_component_id,unique_id interface_id)

{
  ostream *poVar1;
  stringstream oss;
  long *local_1c8 [2];
  long local_1b8 [2];
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  *(undefined ***)this = &PTR__not_providing_0010da58;
  this->_bound_id = bound_component_id;
  this->_interface_id = interface_id;
  (this->_msg)._M_dataplus._M_p = (pointer)&(this->_msg).field_2;
  (this->_msg)._M_string_length = 0;
  (this->_msg).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"component ",10);
  poVar1 = std::ostream::_M_insert<long>((long)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1," is bound as implementing component ",0x24);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1," but isn\'t registered as providing it",0x25);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->_msg,(string *)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

not_providing(
            unique_id bound_component_id,
            unique_id interface_id) throw() :
            exception(),
            _bound_id(bound_component_id),
            _interface_id(interface_id) {
        std::stringstream oss;
        oss <<
            "component " << bound_component_id <<
            " is bound as implementing component " << interface_id <<
            " but isn't registered as providing it";
        _msg = oss.str();
    }